

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::allInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this)

{
  ulong *puVar1;
  int iVar2;
  pointer ppAVar3;
  long lVar4;
  pointer ppRVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  pointer ppTVar8;
  pointer ppIVar9;
  Molecule *pMVar10;
  Atom *pAVar11;
  RigidBody *pRVar12;
  Bond *pBVar13;
  Bend *pBVar14;
  Torsion *pTVar15;
  Inversion *pIVar16;
  pointer ppAVar17;
  pointer ppRVar18;
  pointer ppBVar19;
  pointer ppBVar20;
  pointer ppTVar21;
  pointer pOVar22;
  pointer ppIVar23;
  int iVar24;
  MoleculeIterator mi;
  MoleculeIterator local_30;
  
  createSelectionSets(__return_storage_ptr__,this);
  local_30._M_node = (_Base_ptr)0x0;
  pMVar10 = SimInfo::beginMolecule(this->info,&local_30);
  while (pMVar10 != (Molecule *)0x0) {
    ppAVar17 = (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppAVar3 = (pMVar10->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ppAVar17 != ppAVar3) && (pAVar11 = *ppAVar17, pAVar11 != (Atom *)0x0)) {
      lVar4 = *(long *)&(((__return_storage_ptr__->bitsets_).
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppAVar17 = ppAVar17 + 1;
        iVar2 = (pAVar11->super_StuntDouble).globalIndex_;
        iVar24 = iVar2 + 0x3f;
        if (-1 < (long)iVar2) {
          iVar24 = iVar2;
        }
        puVar1 = (ulong *)(lVar4 + (long)(iVar24 >> 6) * 8 + -8 +
                          (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
      } while ((ppAVar17 != ppAVar3) && (pAVar11 = *ppAVar17, pAVar11 != (Atom *)0x0));
    }
    ppRVar18 = (pMVar10->rigidBodies_).
               super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppRVar5 = (pMVar10->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ppRVar18 != ppRVar5) && (pRVar12 = *ppRVar18, pRVar12 != (RigidBody *)0x0)) {
      lVar4 = *(long *)&(((__return_storage_ptr__->bitsets_).
                          super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                          ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppRVar18 = ppRVar18 + 1;
        iVar2 = (pRVar12->super_StuntDouble).globalIndex_;
        iVar24 = iVar2 + 0x3f;
        if (-1 < (long)iVar2) {
          iVar24 = iVar2;
        }
        puVar1 = (ulong *)(lVar4 + (long)(iVar24 >> 6) * 8 + -8 +
                          (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
      } while ((ppRVar18 != ppRVar5) && (pRVar12 = *ppRVar18, pRVar12 != (RigidBody *)0x0));
    }
    ppBVar19 = (pMVar10->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppBVar6 = (pMVar10->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ppBVar19 != ppBVar6) && (pBVar13 = *ppBVar19, pBVar13 != (Bond *)0x0)) {
      lVar4 = *(long *)&(__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start[1].bitset_.
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppBVar19 = ppBVar19 + 1;
        iVar2 = (pBVar13->super_ShortRangeInteraction).globalIndex_;
        iVar24 = iVar2 + 0x3f;
        if (-1 < (long)iVar2) {
          iVar24 = iVar2;
        }
        puVar1 = (ulong *)(lVar4 + (long)(iVar24 >> 6) * 8 + -8 +
                          (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
      } while ((ppBVar19 != ppBVar6) && (pBVar13 = *ppBVar19, pBVar13 != (Bond *)0x0));
    }
    ppBVar20 = (pMVar10->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppBVar7 = (pMVar10->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ppBVar20 != ppBVar7) && (pBVar14 = *ppBVar20, pBVar14 != (Bend *)0x0)) {
      lVar4 = *(long *)&(__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].bitset_.
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppBVar20 = ppBVar20 + 1;
        iVar2 = (pBVar14->super_ShortRangeInteraction).globalIndex_;
        iVar24 = iVar2 + 0x3f;
        if (-1 < (long)iVar2) {
          iVar24 = iVar2;
        }
        puVar1 = (ulong *)(lVar4 + (long)(iVar24 >> 6) * 8 + -8 +
                          (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
      } while ((ppBVar20 != ppBVar7) && (pBVar14 = *ppBVar20, pBVar14 != (Bend *)0x0));
    }
    ppTVar21 = (pMVar10->torsions_).
               super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppTVar8 = (pMVar10->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((ppTVar21 != ppTVar8) && (pTVar15 = *ppTVar21, pTVar15 != (Torsion *)0x0)) {
      lVar4 = *(long *)&(__return_storage_ptr__->bitsets_).
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start[3].bitset_.
                        super__Bvector_base<std::allocator<bool>_>;
      do {
        ppTVar21 = ppTVar21 + 1;
        iVar2 = (pTVar15->super_ShortRangeInteraction).globalIndex_;
        iVar24 = iVar2 + 0x3f;
        if (-1 < (long)iVar2) {
          iVar24 = iVar2;
        }
        puVar1 = (ulong *)(lVar4 + (long)(iVar24 >> 6) * 8 + -8 +
                          (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
      } while ((ppTVar21 != ppTVar8) && (pTVar15 = *ppTVar21, pTVar15 != (Torsion *)0x0));
    }
    ppIVar23 = (pMVar10->inversions_).
               super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppIVar9 = (pMVar10->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppIVar23 == ppIVar9) {
      pOVar22 = (__return_storage_ptr__->bitsets_).
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pIVar16 = *ppIVar23;
      pOVar22 = (__return_storage_ptr__->bitsets_).
                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pIVar16 != (Inversion *)0x0) {
        lVar4 = *(long *)&pOVar22[4].bitset_.super__Bvector_base<std::allocator<bool>_>;
        do {
          ppIVar23 = ppIVar23 + 1;
          iVar2 = (pIVar16->super_ShortRangeInteraction).globalIndex_;
          iVar24 = iVar2 + 0x3f;
          if (-1 < (long)iVar2) {
            iVar24 = iVar2;
          }
          puVar1 = (ulong *)(lVar4 + (long)(iVar24 >> 6) * 8 + -8 +
                            (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
        } while ((ppIVar23 != ppIVar9) && (pIVar16 = *ppIVar23, pIVar16 != (Inversion *)0x0));
      }
    }
    iVar2 = pMVar10->globalIndex_;
    iVar24 = iVar2 + 0x3f;
    if (-1 < (long)iVar2) {
      iVar24 = iVar2;
    }
    puVar1 = (ulong *)((long)(iVar24 >> 6) * 8 +
                       *(long *)&pOVar22[5].bitset_.super__Bvector_base<std::allocator<bool>_> + -8
                      + (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) * 8);
    *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
    pMVar10 = SimInfo::nextMolecule(this->info,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::allInstruction() {
    SelectionSet ss = createSelectionSets();

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    // Doing the loop insures that we're actually on this processor.

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        ss.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        ss.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        ss.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        ss.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
      }
      ss.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
    }

    return ss;
  }